

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void __thiscall
tcu::TextureCubeArray::TextureCubeArray
          (TextureCubeArray *this,TextureFormat *format,int size,int depth)

{
  int iVar1;
  ConstPixelBufferAccess *levels;
  int depth_local;
  int size_local;
  TextureFormat *format_local;
  TextureCubeArray *this_local;
  
  iVar1 = computeMipPyramidLevels(size);
  TextureLevelPyramid::TextureLevelPyramid(&this->super_TextureLevelPyramid,format,iVar1);
  this->m_size = size;
  this->m_depth = depth;
  iVar1 = TextureLevelPyramid::getNumLevels(&this->super_TextureLevelPyramid);
  levels = &TextureLevelPyramid::getLevels(&this->super_TextureLevelPyramid)->
            super_ConstPixelBufferAccess;
  TextureCubeArrayView::TextureCubeArrayView(&this->m_view,iVar1,levels);
  return;
}

Assistant:

TextureCubeArray::TextureCubeArray (const TextureFormat& format, int size, int depth)
	: TextureLevelPyramid	(format, computeMipPyramidLevels(size))
	, m_size				(size)
	, m_depth				(depth)
	, m_view				(getNumLevels(), getLevels())
{
	DE_ASSERT(m_depth % 6 == 0);
}